

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O1

void duckdb::Node16::ShrinkNode48(ART *art,Node *node16,Node *node48)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  uint16_t i;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar3;
  type paVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  long lVar7;
  byte bVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  
  pBVar3 = BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(art,node16);
  uVar1 = (node48->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar1 & 0xffffffff;
  plVar5 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar5; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar5 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  pdVar6 = pdVar6 + (_Var2._M_head_impl)->bitmask_offset +
                    (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  (node16->super_IndexPointer).data =
       (node48->super_IndexPointer).data & 0x8000000000000000 |
       (node16->super_IndexPointer).data & 0x7fffffffffffffff;
  pBVar3->count = '\0';
  lVar7 = 0;
  bVar8 = 0;
  do {
    if (pdVar6[lVar7 + 1] != '0') {
      pBVar3->key[bVar8] = (uint8_t)lVar7;
      pBVar3->children[bVar8].super_IndexPointer.data =
           *(idx_t *)(pdVar6 + (ulong)pdVar6[lVar7 + 1] * 8 + 0x108);
      bVar8 = bVar8 + 1;
      pBVar3->count = bVar8;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  *pdVar6 = '\0';
  Node::Free(art,node48);
  return;
}

Assistant:

void Node16::ShrinkNode48(ART &art, Node &node16, Node &node48) {
	auto &n16 = New(art, node16);
	auto &n48 = Node::Ref<Node48>(art, node48, NType::NODE_48);
	node16.SetGateStatus(node48.GetGateStatus());

	n16.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (n48.child_index[i] != Node48::EMPTY_MARKER) {
			n16.key[n16.count] = UnsafeNumericCast<uint8_t>(i);
			n16.children[n16.count] = n48.children[n48.child_index[i]];
			n16.count++;
		}
	}

	n48.count = 0;
	Node::Free(art, node48);
}